

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalCSE.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_166::RequestInfo::validate(RequestInfo *this)

{
  bool bVar1;
  RequestInfo *this_local;
  
  bVar1 = false;
  if (this->requests != 0) {
    bVar1 = this->original != (Expression *)0x0;
  }
  if (bVar1) {
    __assert_fail("!(requests && original)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LocalCSE.cpp"
                  ,0xba,"void wasm::(anonymous namespace)::RequestInfo::validate() const");
  }
  bVar1 = true;
  if (this->requests == 0) {
    bVar1 = this->original != (Expression *)0x0;
  }
  if (!bVar1) {
    __assert_fail("requests || original",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LocalCSE.cpp"
                  ,0xbf,"void wasm::(anonymous namespace)::RequestInfo::validate() const");
  }
  return;
}

Assistant:

void validate() const {
    // An expression cannot both be requested and make requests. If we see A
    // appear three times, both repeats must request from the very first.
    assert(!(requests && original));

    // When we encounter a requestInfo (after its initial creation) then it
    // must either request or be requested - otherwise, it should not exist,
    // as we remove unneeded things from our tracking.
    assert(requests || original);
  }